

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O1

void Console::Wrn(char *f,...)

{
  FILE *__s;
  char in_AL;
  long *plVar1;
  undefined8 in_RCX;
  long *plVar2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  long *local_158;
  long local_150;
  long local_148;
  long lStack_140;
  long *local_138;
  long local_130;
  long local_128;
  long lStack_120;
  long *local_118 [2];
  long local_108 [2];
  undefined8 local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  undefined1 local_d8 [8];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined4 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Da;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_d0 = in_RSI;
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if (Styled == '\x01') {
    local_138 = (long *)0x6d33333b315b1b;
    fputs((char *)&local_138,_stdout);
  }
  __s = _stdout;
  local_e8 = local_d8;
  local_f0 = &stack0x00000008;
  local_f8 = 0x3000000008;
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"[WRN] ","");
  plVar1 = (long *)std::__cxx11::string::append((char *)local_118);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_148 = *plVar2;
    lStack_140 = plVar1[3];
    local_158 = &local_148;
  }
  else {
    local_148 = *plVar2;
    local_158 = (long *)*plVar1;
  }
  local_150 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_158);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_128 = *plVar2;
    lStack_120 = plVar1[3];
    local_138 = &local_128;
  }
  else {
    local_128 = *plVar2;
    local_138 = (long *)*plVar1;
  }
  local_130 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  vfprintf(__s,(char *)local_138,&local_f8);
  if (local_138 != &local_128) {
    operator_delete(local_138,local_128 + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,local_148 + 1);
  }
  if (local_118[0] != local_108) {
    operator_delete(local_118[0],local_108[0] + 1);
  }
  if (Styled == '\x01') {
    fputs("\x1b[0m",_stdout);
  }
  return;
}

Assistant:

void Wrn(const char* f, ...)
{
	CONSOLE_GENERIC_OUT("WRN", STREAM_OUT, COLOR_YELLOW, true);
}